

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

string * __thiscall QHybrid::SoftPrintBrief_abi_cxx11_(string *__return_storage_ptr__,QHybrid *this)

{
  QFunctionJointBeliefInterface *pQVar1;
  ostream *poVar2;
  Qheur_t Qheur;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"QHybrid_");
  qheur::SoftPrint_abi_cxx11_(&sStack_1c8,(qheur *)(ulong)this->_m_QheurTypeFirstTS,Qheur);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1c8);
  std::operator<<(poVar2,"_");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  pQVar1 = this->_m_QlastTimeSteps;
  if (pQVar1 == (QFunctionJointBeliefInterface *)0x0) {
    std::operator<<(local_198,"noQlast");
  }
  else {
    (**(code **)(*(long *)((long)&pQVar1->field_0x0 + *(long *)((long)*pQVar1 + -0x60)) + 0x48))
              (&sStack_1c8,(long)&pQVar1->field_0x0 + *(long *)((long)*pQVar1 + -0x60));
    std::operator<<(local_198,(string *)&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
  }
  std::operator<<(local_198,"_hLT");
  if (this->_m_optimizedHorLast == true) {
    std::operator<<(local_198,"0");
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string QHybrid::SoftPrintBrief() const
{
    stringstream ss;
    ss << "QHybrid_"
       << SoftPrint(_m_QheurTypeFirstTS)
       << "_";
    if(_m_QlastTimeSteps)
        ss << _m_QlastTimeSteps->SoftPrintBrief();
    else
        ss << "noQlast";
    ss << "_hLT";
    if(_m_optimizedHorLast)
        ss << "0";
    else
        ss <<_m_horizonLastTimeSteps;
    return(ss.str());
}